

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int amqpvalue_set_map_value(AMQP_VALUE map,AMQP_VALUE key,AMQP_VALUE value)

{
  undefined1 auVar1 [16];
  _Bool _Var2;
  LOGGER_LOG p_Var3;
  AMQP_VALUE value_00;
  AMQP_VALUE value_01;
  void *pvVar4;
  size_t local_a8;
  size_t local_a0;
  ulong local_98;
  LOGGER_LOG l_5;
  size_t realloc_size;
  AMQP_MAP_KEY_VALUE_PAIR *new_pairs;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  AMQP_VALUE cloned_key;
  uint32_t i;
  LOGGER_LOG l_2;
  AMQP_VALUE cloned_value;
  LOGGER_LOG l_1;
  AMQP_VALUE_DATA *value_data;
  LOGGER_LOG l;
  int result;
  AMQP_VALUE value_local;
  AMQP_VALUE key_local;
  AMQP_VALUE map_local;
  
  if (((map == (AMQP_VALUE)0x0) || (key == (AMQP_VALUE)0x0)) || (value == (AMQP_VALUE)0x0)) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_set_map_value",0x616,1,"Bad arguments: map = %p, key = %p, value = %p",
                map,key,value);
    }
    l._4_4_ = 0x617;
  }
  else if (map->type == AMQP_TYPE_MAP) {
    value_00 = amqpvalue_clone(value);
    if (value_00 == (AMQP_VALUE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"amqpvalue_set_map_value",0x62c,1,"Could not clone value to set in the map");
      }
      l._4_4_ = 0x62d;
    }
    else {
      for (cloned_key._4_4_ = 0; cloned_key._4_4_ < (map->value).binary_value.length;
          cloned_key._4_4_ = cloned_key._4_4_ + 1) {
        _Var2 = amqpvalue_are_equal(*(AMQP_VALUE *)
                                     (&((map->value).described_value.descriptor)->type +
                                     (ulong)cloned_key._4_4_ * 4),key);
        if (_Var2) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                      ,"amqpvalue_set_map_value",0x638,1,
                      "Could not allocate NULL value for map entries");
          }
          break;
        }
      }
      if (cloned_key._4_4_ < (map->value).binary_value.length) {
        amqpvalue_destroy((&((map->value).described_value.descriptor)->value)[cloned_key._4_4_].
                          described_value.descriptor);
        (&((map->value).described_value.descriptor)->value)[cloned_key._4_4_].described_value.
        descriptor = value_00;
        l._4_4_ = 0;
      }
      else {
        value_01 = amqpvalue_clone(key);
        if (value_01 == (AMQP_VALUE)0x0) {
          amqpvalue_destroy(value_00);
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                      ,"amqpvalue_set_map_value",0x64f,1,"Could not clone key for map");
          }
          l._4_4_ = 0x650;
        }
        else {
          if ((ulong)(map->value).binary_value.length < 0xfffffffffffffffe) {
            local_98 = (ulong)(map->value).binary_value.length + 1;
          }
          else {
            local_98 = 0xffffffffffffffff;
          }
          if (local_98 == 0) {
            local_a0 = 0;
          }
          else {
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_98;
            if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < 0x10) {
              local_a8 = 0xffffffffffffffff;
            }
            else {
              local_a8 = local_98 << 4;
            }
            local_a0 = local_a8;
          }
          if ((local_a0 == 0xffffffffffffffff) ||
             (pvVar4 = realloc((map->value).binary_value.bytes,local_a0), pvVar4 == (void *)0x0)) {
            amqpvalue_destroy(value_01);
            amqpvalue_destroy(value_00);
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                        ,"amqpvalue_set_map_value",0x65d,1,
                        "Could not reallocate memory for new_pairs map, size:%zu",local_a0);
            }
            l._4_4_ = 0x65e;
          }
          else {
            (map->value).binary_value.bytes = pvVar4;
            *(AMQP_VALUE *)
             (&((map->value).described_value.descriptor)->type +
             (ulong)(map->value).binary_value.length * 4) = value_01;
            (&((map->value).described_value.descriptor)->value)[(map->value).binary_value.length].
            described_value.descriptor = value_00;
            (map->value).binary_value.length = (map->value).binary_value.length + 1;
            l._4_4_ = 0;
          }
        }
      }
    }
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_set_map_value",0x620,1,"Value is not of type MAP");
    }
    l._4_4_ = 0x621;
  }
  return l._4_4_;
}

Assistant:

int amqpvalue_set_map_value(AMQP_VALUE map, AMQP_VALUE key, AMQP_VALUE value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_183: [If any of the arguments are NULL, amqpvalue_set_map_value shall fail and return a non-zero value.] */
    if ((map == NULL) ||
        (key == NULL) ||
        (value == NULL))
    {
        LogError("Bad arguments: map = %p, key = %p, value = %p",
            map, key, value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)map;

        /* Codes_SRS_AMQPVALUE_01_196: [If the map argument is not an AMQP value created with the amqpvalue_create_map function than amqpvalue_set_map_value shall fail and return a non-zero value.] */
        if (value_data->type != AMQP_TYPE_MAP)
        {
            LogError("Value is not of type MAP");
            result = MU_FAILURE;
        }
        else
        {
            AMQP_VALUE cloned_value;

            /* Codes_SRS_AMQPVALUE_01_185: [When storing the key or value, their contents shall be cloned.] */
            cloned_value = amqpvalue_clone(value);
            if (cloned_value == NULL)
            {
                /* Codes_SRS_AMQPVALUE_01_188: [If cloning the value fails, amqpvalue_set_map_value shall fail and return a non-zero value.] */
                LogError("Could not clone value to set in the map");
                result = MU_FAILURE;
            }
            else
            {
                uint32_t i;
                AMQP_VALUE cloned_key;

                for (i = 0; i < value_data->value.map_value.pair_count; i++)
                {
                    if (amqpvalue_are_equal(value_data->value.map_value.pairs[i].key, key))
                    {
                        LogError("Could not allocate NULL value for map entries");
                        break;
                    }
                }

                if (i < value_data->value.map_value.pair_count)
                {
                    /* Codes_SRS_AMQPVALUE_01_184: [If the key already exists in the map, its value shall be replaced with the value provided by the value argument.] */
                    /* Codes_SRS_AMQPVALUE_01_125: [A map in which there exist two identical key values is invalid.] */
                    amqpvalue_destroy(value_data->value.map_value.pairs[i].value);
                    value_data->value.map_value.pairs[i].value = cloned_value;

                    /* Codes_SRS_AMQPVALUE_01_182: [On success amqpvalue_set_map_value shall return 0.] */
                    result = 0;
                }
                else
                {
                    /* Codes_SRS_AMQPVALUE_01_185: [When storing the key or value, their contents shall be cloned.] */
                    cloned_key = amqpvalue_clone(key);
                    if (cloned_key == NULL)
                    {
                        /* Codes_SRS_AMQPVALUE_01_187: [If cloning the key fails, amqpvalue_set_map_value shall fail and return a non-zero value.] */
                        amqpvalue_destroy(cloned_value);
                        LogError("Could not clone key for map");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        AMQP_MAP_KEY_VALUE_PAIR* new_pairs;
                        size_t realloc_size = safe_add_size_t((size_t)value_data->value.map_value.pair_count, 1);
                        realloc_size = safe_multiply_size_t(realloc_size, sizeof(AMQP_MAP_KEY_VALUE_PAIR));
                        if (realloc_size == SIZE_MAX ||
                            (new_pairs = (AMQP_MAP_KEY_VALUE_PAIR*)realloc(value_data->value.map_value.pairs, realloc_size)) == NULL)
                        {
                            /* Codes_SRS_AMQPVALUE_01_186: [If allocating memory to hold a new key/value pair fails, amqpvalue_set_map_value shall fail and return a non-zero value.] */
                            amqpvalue_destroy(cloned_key);
                            amqpvalue_destroy(cloned_value);
                            LogError("Could not reallocate memory for new_pairs map, size:%zu", realloc_size);
                            result = MU_FAILURE;
                        }
                        else
                        {
                            value_data->value.map_value.pairs = new_pairs;

                            /* Codes_SRS_AMQPVALUE_01_181: [amqpvalue_set_map_value shall set the value in the map identified by the map argument for a key/value pair identified by the key argument.] */
                            value_data->value.map_value.pairs[value_data->value.map_value.pair_count].key = cloned_key;
                            value_data->value.map_value.pairs[value_data->value.map_value.pair_count].value = cloned_value;
                            value_data->value.map_value.pair_count++;

                            /* Codes_SRS_AMQPVALUE_01_182: [On success amqpvalue_set_map_value shall return 0.] */
                            result = 0;
                        }
                    }
                }
            }
        }
    }

    return result;
}